

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,
                mrg_parameter<int,_4,_trng::yarn4> *P)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  long in_RSI;
  ostream *in_RDI;
  int i;
  fmtflags flags;
  int local_18;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  std::operator<<(in_RDI,'(');
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    std::ostream::operator<<(in_RDI,*(int *)(in_RSI + (long)local_18 * 4));
    if (local_18 + 1 < 4) {
      std::operator<<(in_RDI,' ');
    }
  }
  std::operator<<(in_RDI,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const mrg_parameter &P) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '(';
      for (int i{0}; i < n; ++i) {
        out << P.a[i];
        if (i + 1 < n)
          out << ' ';
      }
      out << ')';
      out.flags(flags);
      return out;
    }